

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O3

void ncnn::conv3x3s1_winograd23_transform_kernel(Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  void *pvVar4;
  float fVar5;
  int *piVar6;
  int iVar7;
  uint _c;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  Mat *pMVar11;
  int kk;
  ulong uVar12;
  float *pfVar13;
  int iVar14;
  int m;
  long lVar15;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  uint local_118;
  undefined8 local_100;
  undefined1 local_f8 [12];
  float fStack_ec;
  size_t local_e8;
  float local_e0 [2];
  undefined8 local_d8;
  int local_d0;
  int local_cc;
  int local_c8;
  undefined8 local_c4;
  size_t local_b8;
  ulong local_b0;
  ulong local_a8;
  Mat *local_a0;
  ulong local_98;
  ulong local_90;
  uint local_84;
  int local_80;
  uint local_7c;
  Mat local_78;
  
  uVar10 = (ulong)(uint)inch;
  local_a0 = kernel;
  get_optimal_tile_mnk(outch,0,inch,(int *)&local_7c,&local_80,(int *)&local_84,opt->num_threads);
  local_b0 = (ulong)local_7c;
  _c = (int)(local_7c + outch + -1) / (int)local_7c;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  local_a8 = (ulong)(uint)outch;
  Mat::create(&local_78,local_84 * local_7c * 0x10,1,opt->num_threads,4,(Allocator *)0x0);
  Mat::create(AT,local_84 * local_7c,0x10,(int)(local_84 + inch + -1) / (int)local_84,_c,4,
              (Allocator *)0x0);
  if (0 < (int)_c) {
    local_118 = 0;
    local_98 = uVar10;
    do {
      iVar7 = get_omp_thread_num();
      if (0 < (int)uVar10) {
        local_100 = (Mat *)((long)iVar7 * local_78.cstep *
                            CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) +
                           (long)local_78.data);
        iVar7 = (int)local_b0 * local_118;
        uVar8 = (int)local_a8 - iVar7;
        uVar9 = (ulong)uVar8;
        if ((int)local_b0 < (int)uVar8) {
          uVar9 = local_b0 & 0xffffffff;
        }
        local_90 = (ulong)local_118;
        iVar14 = 0;
        do {
          uVar8 = (int)uVar10 - iVar14;
          if ((int)local_84 < (int)uVar8) {
            uVar8 = local_84;
          }
          if (0 < (int)uVar9) {
            pvVar4 = local_a0->data;
            uVar10 = 0;
            pMVar11 = local_100;
            do {
              if (0 < (int)uVar8) {
                uVar12 = 0;
                do {
                  pfVar13 = (float *)((long)pvVar4 +
                                     (uVar12 + (long)iVar14) * 0x24 +
                                     (long)((iVar7 + (int)uVar10) * inch * 9) * 4);
                  lVar15 = 0;
                  do {
                    fVar1 = *pfVar13;
                    fVar2 = pfVar13[2];
                    fVar3 = pfVar13[1];
                    *(float *)(local_f8 + lVar15 * 4) = fVar1;
                    fVar1 = fVar1 * 0.5;
                    fVar5 = fVar2 * 0.5;
                    (&fStack_ec)[lVar15] = fVar3 * 0.5 + fVar1 + fVar5;
                    local_e0[lVar15] = (fVar1 - fVar3 * 0.5) + fVar5;
                    *(float *)((long)&local_d8 + lVar15 * 4 + 4) = fVar2;
                    pfVar13 = pfVar13 + 3;
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  lVar15 = 8;
                  do {
                    fVar1 = *(float *)(local_f8 + lVar15);
                    fVar2 = *(float *)((long)&local_100 + lVar15) * 0.5;
                    fVar3 = *(float *)((long)&local_100 + lVar15 + 4) * 0.5;
                    fVar5 = fVar1 * 0.5;
                    *(float *)&pMVar11->data = *(float *)((long)&local_100 + lVar15);
                    *(float *)((long)&pMVar11->data + 4) = fVar3 + fVar2 + fVar5;
                    *(float *)&pMVar11->refcount = (fVar2 - fVar3) + fVar5;
                    *(float *)((long)&pMVar11->refcount + 4) = fVar1;
                    pMVar11 = (Mat *)&pMVar11->elemsize;
                    lVar15 = lVar15 + 0xc;
                  } while (lVar15 != 0x38);
                  uVar12 = uVar12 + 1;
                } while (uVar12 != uVar8);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar9);
          }
          local_cc = AT->w;
          local_e8 = AT->elemsize;
          local_c8 = AT->h;
          local_e0[0] = (float)AT->elempack;
          local_d8 = AT->allocator;
          local_b8 = (long)local_c8 * (long)local_cc;
          local_f8._0_8_ =
               (long)AT->data +
               local_e8 * local_b8 * (long)(iVar14 / (int)local_84) +
               AT->cstep * local_90 * local_e8;
          stack0xffffffffffffff10 = (int *)0x0;
          local_d0 = 2;
          local_c4._0_4_ = 1;
          local_c4._4_4_ = 1;
          pack_A_tile(local_100,(Mat *)local_f8,0x10,(int)uVar9,uVar8);
          iVar14 = iVar14 + local_84;
          uVar10 = local_98;
        } while (iVar14 < (int)local_98);
      }
      local_118 = local_118 + 1;
    } while (local_118 != _c);
  }
  piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    const int M = outch;
    const int K = inch;
    const int B = 16;

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, 0, K, TILE_M, TILE_N, TILE_K, opt.num_threads);

    const int nn_M = (M + TILE_M - 1) / TILE_M;

    Mat A_tileX(B * TILE_M * TILE_K, 1, opt.num_threads, 4u, (Allocator*)0);

    AT.create(TILE_K * TILE_M, B, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat A_tile = A_tileX.channel(get_omp_thread_num());

        for (int k = 0; k < K; k += TILE_K)
        {
            const int max_ii = std::min((M - i), TILE_M);
            const int max_kk = std::min((K - k), TILE_K);

            conv3x3s1_winograd23_transform_kernel_tile(kernel, A_tile, inch, i, max_ii, k, max_kk);

            Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

            pack_A_tile(A_tile, AT_tile, B, max_ii, max_kk);
        }
    }
}